

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O0

void __thiscall
SPTest_ConstantExprInExpectation_Test::~SPTest_ConstantExprInExpectation_Test
          (SPTest_ConstantExprInExpectation_Test *this)

{
  void *in_RDI;
  
  ~SPTest_ConstantExprInExpectation_Test((SPTest_ConstantExprInExpectation_Test *)0x128d38);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SPTest, ConstantExprInExpectation) {
  TestBasicProblem p(1);
  p.AddExpectationObj(
        p.MakeBinary(expr::MUL, p.MakeNumericConstant(6),
                     p.MakeNumericConstant(7)));
  mp::SPAdapter sp(p);
  auto constant = mp::Cast<mp::NumericConstant>(sp.obj(0).nonlinear_expr());
  EXPECT_EQ(42, constant.value());
}